

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

char * __thiscall moira::Moira::availabilityString(Moira *this,Instr I,Mode M,Size S,u16 ext)

{
  u16 uVar1;
  u16 ext_local;
  Size S_local;
  Mode M_local;
  Instr I_local;
  Moira *this_local;
  
  uVar1 = availabilityMask(this,I,M,S,ext);
  if (uVar1 == 0xc) {
    this_local = (Moira *)0x57df47;
  }
  else if (uVar1 == 0x3c) {
    this_local = (Moira *)0x57de05;
  }
  else if (uVar1 == 0x1c0) {
    this_local = (Moira *)0x57834a;
  }
  else if (uVar1 == 0x1fc) {
    this_local = (Moira *)0x57df57;
  }
  else if (uVar1 == 0x1fe) {
    this_local = (Moira *)0x57d9e5;
  }
  else {
    this_local = (Moira *)0x578351;
  }
  return (char *)this_local;
}

Assistant:

const char *
Moira::availabilityString(Instr I, Mode M, Size S, u16 ext)
{
    switch (availabilityMask(I, M, S, ext)) {

        case AV::M68010_UP:           return "(1+)";
        case AV::M68020:              return "(2)";
        case AV::M68020 | AV::M68030: return "(2-3)";
        case AV::M68020_UP:           return "(2+)";
        case AV::M68040:              return "(4+)";

        default:
            return "(?)";
    }
}